

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O0

void __thiscall
TEST_TestHarness_c_checkSignedByte_Test::testBody(TEST_TestHarness_c_checkSignedByte_Test *this)

{
  TestTestingFixture *pTVar1;
  byte bVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_TestHarness_c_checkSignedByte_Test *local_10;
  TEST_TestHarness_c_checkSignedByte_Test *this_local;
  
  local_10 = this;
  CHECK_EQUAL_C_SBYTE_LOCATION
            (-3,-3,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
             ,0x1e9);
  TestTestingFixture::setTestFunction
            ((this->super_TEST_GROUP_CppUTestGroupTestHarness_c).fixture,failSignedByteMethod_);
  TestTestingFixture::runAllTests((this->super_TEST_GROUP_CppUTestGroupTestHarness_c).fixture);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestHarness_c).fixture;
  SimpleString::SimpleString(&local_20,"expected <-3>\n\tbut was  <-5>");
  TestTestingFixture::assertPrintContains(pTVar1,&local_20);
  SimpleString::~SimpleString(&local_20);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestHarness_c).fixture;
  SimpleString::SimpleString(local_40,"arness_c");
  TestTestingFixture::assertPrintContains(pTVar1,local_40);
  SimpleString::~SimpleString(local_40);
  pUVar3 = UtestShell::getCurrent();
  bVar2 = hasDestructorOfTheDestructorCheckedBeenCalled ^ 0xff;
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)(bVar2 & 1),"CHECK","!hasDestructorOfTheDestructorCheckedBeenCalled",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
             ,0x1ee,pTVar4);
  return;
}

Assistant:

TEST(TestHarness_c, checkSignedByte)
{
    CHECK_EQUAL_C_SBYTE(-3, -3);
    fixture->setTestFunction(failSignedByteMethod_);
    fixture->runAllTests();
    fixture->assertPrintContains("expected <-3>\n\tbut was  <-5>");
    fixture->assertPrintContains("arness_c");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}